

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSLUtils.cpp
# Opt level: O0

String * __thiscall
Diligent::BuildHLSLSourceString_abi_cxx11_
          (String *__return_storage_ptr__,Diligent *this,ShaderCreateInfo *ShaderCI)

{
  bool bVar1;
  char *local_48;
  ShaderCreateInfo *ShaderCI_local;
  String *HLSLSource;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  AppendShaderTypeDefinitions(__return_storage_ptr__,*(SHADER_TYPE *)(this + 0x48));
  bVar1 = ShaderMacroArray::operator_cast_to_bool((ShaderMacroArray *)(this + 0x30));
  if (bVar1) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\n');
    AppendShaderMacros(__return_storage_ptr__,(ShaderMacroArray *)(this + 0x30));
  }
  if (*(long *)this == 0) {
    local_48 = *(char **)(this + 0x40);
  }
  else {
    local_48 = *(char **)this;
  }
  AppendLine1Marker(__return_storage_ptr__,local_48);
  AppendShaderSourceCode(__return_storage_ptr__,(ShaderCreateInfo *)this);
  return __return_storage_ptr__;
}

Assistant:

String BuildHLSLSourceString(const ShaderCreateInfo& ShaderCI) noexcept(false)
{
    String HLSLSource;

    HLSLSource.append(g_HLSLDefinitions);
    AppendShaderTypeDefinitions(HLSLSource, ShaderCI.Desc.ShaderType);

    if (ShaderCI.Macros)
    {
        HLSLSource += '\n';
        AppendShaderMacros(HLSLSource, ShaderCI.Macros);
    }

    AppendLine1Marker(HLSLSource, ShaderCI.FilePath != nullptr ? ShaderCI.FilePath : ShaderCI.Desc.Name);
    AppendShaderSourceCode(HLSLSource, ShaderCI);

    return HLSLSource;
}